

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mostream.hh
# Opt level: O0

void __thiscall OpenMesh::multiplex_streambuf::multiplex_streambuf(multiplex_streambuf *this)

{
  multiplex_streambuf *this_local;
  
  std::streambuf::streambuf((streambuf *)this);
  *(undefined ***)this = &PTR__multiplex_streambuf_003debb0;
  std::
  vector<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>::
  vector(&this->targets_);
  std::
  map<void_*,_OpenMesh::basic_multiplex_target_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>_>
  ::map(&this->target_map_);
  std::__cxx11::string::string((string *)&this->buffer_);
  this->enabled_ = true;
  std::__cxx11::string::reserve((ulong)&this->buffer_);
  return;
}

Assistant:

multiplex_streambuf() : enabled_(true) { buffer_.reserve(100); }